

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::file_rename_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_rename_failed_alert *this)

{
  error_category *peVar1;
  char msg [200];
  string asStack_108 [32];
  char local_e8 [208];
  
  torrent_alert::message_abi_cxx11_(__return_storage_ptr__,&this->super_torrent_alert);
  snprintf(local_e8,200,": failed to rename file %d: ",
           (ulong)*(uint *)&(this->super_torrent_alert).field_0x2c);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(asStack_108,peVar1,(ulong)(uint)(this->error).val_);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string(asStack_108);
  return __return_storage_ptr__;
}

Assistant:

std::string file_rename_failed_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		std::string ret { torrent_alert::message() };
		char msg[200];
		std::snprintf(msg, sizeof(msg), ": failed to rename file %d: "
			, static_cast<int>(index));
		ret.append(msg);
		ret.append(error.message());
		return ret;
#endif
	}